

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_radio.c
# Opt level: O0

void radio_bang(t_radio *x)

{
  t_float local_40;
  undefined1 local_38 [4];
  t_float outval;
  t_atom at [2];
  t_radio *x_local;
  
  if (x->x_compat == 0) {
    if (pd_compatibilitylevel < 0x2e) {
      local_40 = (t_float)x->x_on;
    }
    else {
      local_40 = x->x_fval;
    }
    outlet_float((x->x_gui).x_obj.te_outlet,local_40);
    if ((((uint)(x->x_gui).x_fsf >> 7 & 1) != 0) && (((x->x_gui).x_snd)->s_thing != (_class **)0x0))
    {
      pd_float(((x->x_gui).x_snd)->s_thing,local_40);
    }
  }
  else {
    if ((x->x_change != 0) && (x->x_on != x->x_on_old)) {
      local_38 = (undefined1  [4])0x1;
      at[0].a_type = (t_atomtype)(float)x->x_on_old;
      at[0].a_w.w_float = 1.4013e-45;
      at[1].a_type = A_NULL;
      outlet_list((x->x_gui).x_obj.te_outlet,&s_list,2,(t_atom *)local_38);
      if ((((uint)(x->x_gui).x_fsf >> 7 & 1) != 0) &&
         (((x->x_gui).x_snd)->s_thing != (_class **)0x0)) {
        pd_list(((x->x_gui).x_snd)->s_thing,&s_list,2,(t_atom *)local_38);
      }
    }
    x->x_on_old = x->x_on;
    local_38 = (undefined1  [4])0x1;
    at[0].a_type = (t_atomtype)(float)x->x_on;
    at[0].a_w.w_float = 1.4013e-45;
    at[1].a_type = 0x3f800000;
    outlet_list((x->x_gui).x_obj.te_outlet,&s_list,2,(t_atom *)local_38);
    if ((((uint)(x->x_gui).x_fsf >> 7 & 1) != 0) && (((x->x_gui).x_snd)->s_thing != (_class **)0x0))
    {
      pd_list(((x->x_gui).x_snd)->s_thing,&s_list,2,(t_atom *)local_38);
    }
  }
  return;
}

Assistant:

static void radio_bang(t_radio *x)
{
    if(x->x_compat)
    {
            /* compatibility with earlier "[hv]dial" behavior */
        t_atom at[2];
        if((x->x_change) && (x->x_on != x->x_on_old))
        {
            SETFLOAT(at+0, (t_float)x->x_on_old);
            SETFLOAT(at+1, 0.0);
            outlet_list(x->x_gui.x_obj.ob_outlet, &s_list, 2, at);
            if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing)
                pd_list(x->x_gui.x_snd->s_thing, &s_list, 2, at);
        }
        x->x_on_old = x->x_on;
        SETFLOAT(at+0, (t_float)x->x_on);
        SETFLOAT(at+1, 1.0);
        outlet_list(x->x_gui.x_obj.ob_outlet, &s_list, 2, at);
        if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing)
            pd_list(x->x_gui.x_snd->s_thing, &s_list, 2, at);
    }
    else
    {
        t_float outval = (pd_compatibilitylevel < 46 ? x->x_on : x->x_fval);
        outlet_float(x->x_gui.x_obj.ob_outlet, outval);
        if(x->x_gui.x_fsf.x_snd_able && x->x_gui.x_snd->s_thing)
            pd_float(x->x_gui.x_snd->s_thing, outval);
    }
}